

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall
pbrt::PixelStatsAccumulator::ReportRatio
          (PixelStatsAccumulator *this,Point2i *p,int statIndex,char *name,int64_t num,int64_t denom
          )

{
  Image *this_00;
  PixelStats *pPVar1;
  Tuple2<pbrt::Point2,_int> resolution;
  Allocator alloc;
  ulong uVar2;
  pointer pIVar3;
  Point2i p_00;
  long lVar4;
  Float FVar5;
  Float FVar6;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator<char> local_163;
  allocator<char> local_162;
  allocator<char> local_161;
  int64_t local_160;
  WrapMode2D local_158;
  WrapMode2D local_150;
  WrapMode2D local_148;
  WrapMode2D local_140;
  WrapMode2D local_138;
  ColorEncodingHandle local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108 [32];
  string local_e8 [32];
  Image local_c8;
  
  pPVar1 = this->stats;
  uVar2 = (ulong)statIndex;
  pIVar3 = (pPVar1->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_160 = denom;
  if ((ulong)(((long)(pPVar1->ratioImages).
                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pIVar3) / 0x98) <= uVar2) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (&pPVar1->ratioImages,(long)(statIndex + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->stats->ratioNames,(long)(statIndex + 1));
    std::__cxx11::string::assign
              ((char *)((this->stats->ratioNames).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar2));
    pIVar3 = (this->stats->ratioImages).
             super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  this_00 = pIVar3 + uVar2;
  resolution = (Tuple2<pbrt::Point2,_int>)Bounds2<int>::Diagonal((Bounds2<int> *)imageBounds);
  if (pIVar3[uVar2].resolution.super_Tuple2<pbrt::Point2,_int> != resolution) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"numerator",&local_161);
    std::__cxx11::string::string<std::allocator<char>>(local_108,"denominator",&local_162);
    std::__cxx11::string::string<std::allocator<char>>(local_e8,"ratio",&local_163);
    local_130.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 3;
    channels.ptr = &local_128;
    Image::Image(&local_c8,Float,(Point2i)resolution,channels,&local_130,alloc);
    Image::operator=(this_00,&local_c8);
    Image::~Image(&local_c8);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_128._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.x =
       (p->super_Tuple2<pbrt::Point2,_int>).x - imageBounds._0_4_;
  p_00.super_Tuple2<pbrt::Point2,_int>.y =
       (p->super_Tuple2<pbrt::Point2,_int>).y - imageBounds._4_4_;
  WrapMode2D::WrapMode2D(&local_138,Clamp);
  FVar5 = Image::GetChannel(this_00,p_00,0,local_138);
  Image::SetChannel(this_00,p_00,0,FVar5 + (float)num);
  WrapMode2D::WrapMode2D(&local_140,Clamp);
  FVar5 = Image::GetChannel(this_00,p_00,1,local_140);
  Image::SetChannel(this_00,p_00,1,FVar5 + (float)local_160);
  WrapMode2D::WrapMode2D(&local_148,Clamp);
  FVar5 = Image::GetChannel(this_00,p_00,0,local_148);
  FVar6 = 0.0;
  if ((FVar5 != 0.0) || (NAN(FVar5))) {
    WrapMode2D::WrapMode2D(&local_150,Clamp);
    FVar5 = Image::GetChannel(this_00,p_00,0,local_150);
    local_160 = CONCAT44(local_160._4_4_,FVar5);
    WrapMode2D::WrapMode2D(&local_158,Clamp);
    FVar6 = Image::GetChannel(this_00,p_00,1,local_158);
    FVar6 = (float)local_160 / FVar6;
  }
  Image::SetChannel(this_00,p_00,2,FVar6);
  return;
}

Assistant:

void PixelStatsAccumulator::ReportRatio(const Point2i &p, int statIndex, const char *name,
                                        int64_t num, int64_t denom) {
    if (statIndex >= stats->ratioImages.size()) {
        stats->ratioImages.resize(statIndex + 1);
        stats->ratioNames.resize(statIndex + 1);
        stats->ratioNames[statIndex] = name;
    }

    Image &im = stats->ratioImages[statIndex];
    Point2i res = Point2i(imageBounds.Diagonal());
    if (im.Resolution() != res)
        im = Image(PixelFormat::Float, res, {"numerator", "denominator", "ratio"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    im.SetChannel(pp, 0, im.GetChannel(pp, 0) + num);
    im.SetChannel(pp, 1, im.GetChannel(pp, 1) + denom);
    if (im.GetChannel(pp, 0) == 0)
        im.SetChannel(pp, 2, 0);
    else
        im.SetChannel(pp, 2, im.GetChannel(pp, 0) / im.GetChannel(pp, 1));
}